

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void MNS::Server::onClose(uv_handle_t *handle)

{
  bool bVar1;
  long *in_RDI;
  Server *server;
  SocketData *data;
  key_type *in_stack_ffffffffffffffd8;
  function<void_(MNS::SocketData_*)> *in_stack_ffffffffffffffe0;
  SocketData *this;
  Server *__args;
  
  this = (SocketData *)*in_RDI;
  __args = this->server;
  if ((__args != (Server *)0x0) &&
     (bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffffe0), bVar1)) {
    std::function<void_(MNS::SocketData_*)>::operator()
              ((function<void_(MNS::SocketData_*)> *)this,(SocketData *)__args);
  }
  std::
  unordered_map<int,_uv_poll_s_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_uv_poll_s_*>_>_>
  ::erase((unordered_map<int,_uv_poll_s_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_uv_poll_s_*>_>_>
           *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  close(*(int *)&((_Function_base *)&this->fd)->_M_functor);
  if (this != (SocketData *)0x0) {
    SocketData::~SocketData(this);
    operator_delete(this);
  }
  free(in_RDI);
  return;
}

Assistant:

void MNS::Server::onClose(uv_handle_t *handle) {
	MNS::SocketData *data = static_cast<MNS::SocketData *>(handle->data);
	// Deregister NodeJS Persistent<Object>
	MNS::Server *server = data->server;
	if(server && server->onHttpCancelHandler) server->onHttpCancelHandler(data);

	polls.erase(data->fd);
	close(data->fd);
	delete (data);
	free(handle);
}